

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestGateway::export_(TestGateway *this,ExportContext context)

{
  CapTableReader *pCVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  Disposer *pDVar5;
  RequestHook *pRVar6;
  undefined4 uVar7;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  _func_int **in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar8;
  int in_R8D;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Promise<void> PVar14;
  Client cap;
  undefined1 local_f0 [16];
  CapTableReader *local_e0;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_d8;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_98;
  undefined1 local_58 [32];
  Maybe<capnp::MessageSize> local_38;
  
  (**(code **)*in_RDX)(local_58);
  local_98.super_Builder._builder.data = (void *)local_58._16_8_;
  local_98.super_Builder._builder.pointers = (WirePointer *)local_58._24_8_;
  local_98.super_Builder._builder.segment = (SegmentBuilder *)local_58._0_8_;
  local_98.super_Builder._builder.capTable = (CapTableBuilder *)local_58._8_8_;
  PointerReader::getStruct((StructReader *)&local_d8,(PointerReader *)&local_98,(word *)0x0);
  bVar9 = local_d8.super_Builder._builder.pointerCount != 0;
  local_98.super_Builder._builder.data = (WirePointer *)0x0;
  if (bVar9) {
    local_98.super_Builder._builder.data = local_d8.super_Builder._builder.pointers;
  }
  uVar7 = 0x7fffffff;
  if (bVar9) {
    uVar7 = local_d8.hook.disposer._0_4_;
  }
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  if (bVar9) {
    uVar10 = local_d8.super_Builder._builder.segment._0_4_;
    uVar11 = local_d8.super_Builder._builder.segment._4_4_;
    uVar12 = local_d8.super_Builder._builder.capTable._0_4_;
    uVar13 = local_d8.super_Builder._builder.capTable._4_4_;
  }
  local_98.super_Builder._builder.segment = (SegmentBuilder *)CONCAT44(uVar11,uVar10);
  local_98.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar13,uVar12);
  local_98.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_98.super_Builder._builder.pointers._4_4_,uVar7);
  PointerReader::getCapability((PointerReader *)local_58);
  local_f0._8_8_ = local_58._0_8_;
  local_e0 = (CapTableReader *)local_58._8_8_;
  local_f0._0_8_ =
       &Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::Client::typeinfo;
  (**(code **)(*in_RDX + 8))();
  local_38.ptr.isSet = false;
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::saveRequest
            (&local_98,(Client *)local_f0,&local_38);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::send(&local_d8,(int)&local_98,__buf,in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_d8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1087:15),_kj::_::PropagateException>
             ::anon_class_8_1_bc11688f_for_func::operator());
  pDVar5 = local_d8.hook.disposer;
  uVar4 = local_d8.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060f020;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RDX;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>,capnp::_::(anonymous_namespace)::TestGateway::export_(capnp::CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>)::{lambda(capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>)#1},kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  pPVar8 = extraout_RDX;
  if (local_d8.super_Builder._builder._32_8_ != 0) {
    local_d8.super_Builder._builder.dataSize = 0;
    local_d8.super_Builder._builder.pointerCount = 0;
    local_d8.super_Builder._builder._38_2_ = 0;
    local_d8.hook.disposer = (Disposer *)0x0;
    (**(local_d8.hook.ptr)->_vptr_RequestHook)(local_d8.hook.ptr,uVar4,8,pDVar5,pDVar5,0);
    pPVar8 = extraout_RDX_00;
  }
  pWVar3 = local_d8.super_Builder._builder.pointers;
  if (local_d8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_d8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_d8.super_Builder._builder.data)
              (local_d8.super_Builder._builder.data,
               (long)&(pWVar3->offsetAndKind).value + *(long *)((long)*pWVar3 + -0x10));
    pPVar8 = extraout_RDX_01;
  }
  pCVar2 = local_d8.super_Builder._builder.capTable;
  if (local_d8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_d8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_d8.super_Builder._builder.segment._4_4_,
                         local_d8.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_d8.super_Builder._builder.segment._4_4_,
                        local_d8.super_Builder._builder.segment._0_4_),
               (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar2->super_CapTableReader);
    pPVar8 = extraout_RDX_02;
  }
  pRVar6 = local_98.hook.ptr;
  if (local_98.hook.ptr != (RequestHook *)0x0) {
    local_98.hook.ptr = (RequestHook *)0x0;
    (**(local_98.hook.disposer)->_vptr_Disposer)
              (local_98.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
    pPVar8 = extraout_RDX_03;
  }
  pCVar1 = local_e0;
  if (local_e0 != (CapTableReader *)0x0) {
    local_e0 = (CapTableReader *)0x0;
    (*(code *)((SegmentReader *)local_f0._8_8_)->arena->_vptr_Arena)
              (local_f0._8_8_,
               ((CapTableReader *)&pCVar1->_vptr_CapTableReader)->_vptr_CapTableReader[-2] +
               (long)&pCVar1->_vptr_CapTableReader);
    pPVar8 = extraout_RDX_04;
  }
  PVar14.super_PromiseBase.node.ptr = pPVar8;
  PVar14.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar14.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> export_(ExportContext context) override {
    auto cap = context.getParams().getCap();
    context.releaseParams();
    return cap.saveRequest().send()
        .then([KJ_CPCAP(context)]
            (Response<Persistent<test::TestSturdyRef>::SaveResults> response) mutable {
      context.getResults().setSturdyRef(kj::str("exported-",
          response.getSturdyRef().getObjectId().getAs<Text>()));
    });
  }